

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_fnmatch(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  uint uVar2;
  uchar *zPattern_00;
  uchar *zString_00;
  uint local_40;
  int rc;
  int noCase;
  int iEsc;
  char *zPattern;
  char *zString;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  rc = 0x5c;
  local_40 = 0;
  if (((nArg < 2) || (iVar1 = jx9_value_is_string(*apArg), iVar1 == 0)) ||
     (iVar1 = jx9_value_is_string(apArg[1]), iVar1 == 0)) {
    jx9_result_bool(pCtx,0);
  }
  else {
    zPattern_00 = (uchar *)jx9_value_to_string(*apArg,(int *)0x0);
    zString_00 = (uchar *)jx9_value_to_string(apArg[1],(int *)0x0);
    if ((2 < nArg) && (iVar1 = jx9_value_is_int(apArg[2]), iVar1 != 0)) {
      uVar2 = jx9_value_to_int(apArg[2]);
      if ((uVar2 & 1) != 0) {
        rc = 0;
      }
      local_40 = (uint)((uVar2 & 8) != 0);
    }
    iVar1 = Glob(zPattern_00,zString_00,rc,local_40);
    jx9_result_bool(pCtx,iVar1);
  }
  return 0;
}

Assistant:

static int jx9Builtin_fnmatch(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString, *zPattern;
	int iEsc = '\\';
	int noCase = 0;
	int rc;
	if( nArg < 2 || !jx9_value_is_string(apArg[0]) || !jx9_value_is_string(apArg[1]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the pattern and the string */
	zPattern  = jx9_value_to_string(apArg[0], 0);
	zString = jx9_value_to_string(apArg[1], 0);
	/* Extract the flags if avaialble */
	if( nArg > 2 && jx9_value_is_int(apArg[2]) ){
		rc = jx9_value_to_int(apArg[2]);
		if( rc & 0x01 /*FNM_NOESCAPE*/){
			iEsc = 0;
		}
		if( rc & 0x08 /*FNM_CASEFOLD*/){
			noCase = 1;
		}
	}
	/* Go globbing */
	rc = Glob((const unsigned char *)zPattern, (const unsigned char *)zString, iEsc, noCase);
	/* Globbing result */
	jx9_result_bool(pCtx, rc);
	return JX9_OK;
}